

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  long *plVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  pointer pLVar8;
  pointer pLVar9;
  int iVar10;
  ostream *poVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  size_t pixel_size;
  float *pfVar18;
  int unaff_EBP;
  size_t jj;
  char *pcVar19;
  long lVar20;
  long lVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  pointer pLVar23;
  size_type *psVar24;
  long lVar25;
  int *piVar26;
  ulong uVar27;
  size_t pixel_size_1;
  EXRTile *pEVar28;
  size_t jj_1;
  ulong uVar29;
  float fVar30;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  string ch_name;
  EXRImage exr_image;
  EXRVersion exr_version;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  EXRHeader exr_header;
  float *local_480;
  long local_478;
  int local_470;
  long local_468;
  float *local_460;
  int local_450;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_448;
  long *local_428;
  ulong local_420;
  long local_418 [2];
  EXRImage local_408;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  EXRTile *local_3b8;
  long local_3b0;
  int *local_3a8;
  int *local_3a0;
  long *local_398;
  long local_390;
  long local_388 [2];
  EXRVersion local_374;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [6];
  ios_base local_2e0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  int *local_1b8 [2];
  long local_1a8 [5];
  int local_180;
  int local_17c;
  int local_178;
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int *local_138;
  
  if (out_rgba == (float **)0x0) {
    piVar26 = (int *)((long)&((EXRHeader *)local_1b8)->data_window + 8);
    local_1b8[0] = piVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Invalid argument for LoadEXR()","");
    if (err != (char **)0x0) {
      pcVar12 = strdup((char *)local_1b8[0]);
      *err = pcVar12;
    }
    if (local_1b8[0] != piVar26) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    return -3;
  }
  memset((EXRHeader *)local_1b8,0,0x188);
  local_408.tiles = (EXRTile *)0x0;
  local_408.next_level = (TEXRImage *)0x0;
  local_408.level_x = 0;
  local_408.level_y = 0;
  local_408.images = (uchar **)0x0;
  local_408.width = 0;
  local_408.height = 0;
  local_408.num_channels = 0;
  local_408.num_tiles = 0;
  iVar10 = ParseEXRVersionFromFile(&local_374,filename);
  if (iVar10 == 0) {
    if (local_374.non_image != 0 || local_374.multipart != 0) {
      local_360 = (undefined1  [8])&local_350;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_360,
                 "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
      if (err != (char **)0x0) {
        pcVar12 = strdup((char *)local_360);
        *err = pcVar12;
      }
      if (local_360 != (undefined1  [8])&local_350) {
        operator_delete((void *)local_360,local_350 + 1);
      }
      iVar10 = -4;
      goto LAB_005d3ac2;
    }
    bVar7 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_360);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_350,
               "Failed to open EXR file or read version info from EXR file. code(",0x41);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_350,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar12 = strdup((char *)local_428);
      *err = pcVar12;
    }
    if (local_428 != local_418) {
      operator_delete(local_428,local_418[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_360);
    std::ios_base::~ios_base(local_2e0);
LAB_005d3ac2:
    bVar7 = false;
    unaff_EBP = iVar10;
  }
  if (!bVar7) {
    return unaff_EBP;
  }
  iVar10 = ParseEXRHeaderFromFile((EXRHeader *)local_1b8,&local_374,filename,err);
  if (iVar10 != 0) {
    FreeEXRHeader((EXRHeader *)local_1b8);
    return iVar10;
  }
  if (0 < local_140) {
    lVar16 = 0;
    do {
      if (local_148[lVar16] == 1) {
        local_138[lVar16] = 2;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_140);
  }
  iVar10 = LoadEXRImageFromFile(&local_408,(EXRHeader *)local_1b8,filename,err);
  if (iVar10 != 0) {
    FreeEXRHeader((EXRHeader *)local_1b8);
    return iVar10;
  }
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers((EXRHeader *)local_1b8,&local_1d8);
  local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8 = local_3c8;
  local_3a0 = height;
  if (layername == (char *)0x0) {
    pcVar12 = "";
    pcVar19 = "";
  }
  else {
    sVar13 = strlen(layername);
    pcVar12 = layername + sVar13;
    pcVar19 = layername;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,pcVar19,pcVar12);
  pLVar9 = local_448.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar8 = local_448.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    paVar22 = &((local_448.
                 super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start)->name).field_2;
    do {
      plVar1 = (long *)(((string *)(paVar22 + -1))->_M_dataplus)._M_p;
      if (paVar22 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar1) {
        operator_delete(plVar1,paVar22->_M_allocated_capacity + 1);
      }
      pLVar23 = (pointer)(paVar22 + 1);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar22 + 0x28);
    } while (pLVar23 != pLVar9);
    local_448.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar8;
  }
  local_3a8 = width;
  if (0 < local_140) {
    lVar16 = 0;
    psVar24 = (size_type *)0x0;
    do {
      std::__cxx11::string::string
                ((string *)&local_428,local_150->name + lVar16,(allocator *)local_360);
      if (local_3d0 == 0) {
        uVar29 = std::__cxx11::string::rfind((char)(string *)&local_428,0x2e);
        if ((uVar29 == 0xffffffffffffffff) || (local_420 <= uVar29)) goto LAB_005d3da8;
        if (uVar29 == 0) goto LAB_005d3d69;
      }
      else {
        local_360 = (undefined1  [8])&local_350;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,local_3d8,local_3d0 + (long)local_3d8);
        std::__cxx11::string::_M_replace_aux((ulong)local_360,(ulong)local_358._M_p,0,'\x01');
        lVar14 = std::__cxx11::string::find((char *)&local_428,(ulong)local_360,0);
        if (local_360 != (undefined1  [8])&local_350) {
          operator_delete((void *)local_360,local_350 + 1);
        }
        if (lVar14 != -1) {
          if (lVar14 == 0) {
LAB_005d3d69:
            std::__cxx11::string::substr((ulong)local_360,(ulong)&local_428);
            std::__cxx11::string::operator=((string *)&local_428,(string *)local_360);
            if (local_360 != (undefined1  [8])&local_350) {
              operator_delete((void *)local_360,local_350 + 1);
            }
          }
LAB_005d3da8:
          local_398 = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,local_428,(long)local_428 + local_420);
          local_358._M_p = (pointer)local_348;
          local_360 = (undefined1  [8])psVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_358,local_398,local_390 + (long)local_398);
          if (local_398 != local_388) {
            operator_delete(local_398,local_388[0] + 1);
          }
          std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                    (&local_448,(value_type *)local_360);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_p != local_348) {
            operator_delete(local_358._M_p,local_348[0]._M_allocated_capacity + 1);
          }
        }
      }
      if (local_428 != local_418) {
        operator_delete(local_428,local_418[0] + 1);
      }
      psVar24 = (size_type *)((long)psVar24 + 1);
      lVar16 = lVar16 + 0x110;
    } while ((long)psVar24 < (long)local_140);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  if ((long)local_448.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_448.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    if (layername == (char *)0x0) {
      pcVar19 = 
      "Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer."
      ;
      pcVar12 = "";
    }
    else {
      pcVar19 = "Layer Not Found";
      pcVar12 = "";
    }
    local_360 = (undefined1  [8])&local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,pcVar19,pcVar12);
    if (err != (char **)0x0) {
      pcVar12 = strdup((char *)local_360);
      *err = pcVar12;
    }
    if (local_360 != (undefined1  [8])&local_350) {
      operator_delete((void *)local_360,local_350 + 1);
    }
    iVar10 = -0xd;
    goto LAB_005d4498;
  }
  uVar15 = ((long)local_448.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_448.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar29 = 4;
  if (uVar15 < 4) {
    uVar29 = uVar15;
  }
  local_470 = -1;
  lVar16 = 0;
  local_450 = -1;
  local_468._0_4_ = -1;
  local_480._0_4_ = -1;
  do {
    pcVar12 = (char *)((long)&((local_448.
                                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar16);
    piVar26 = (int *)((long)&(local_448.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar16);
    iVar10 = std::__cxx11::string::compare(pcVar12);
    if (iVar10 == 0) {
      local_470 = *piVar26;
    }
    else {
      iVar10 = std::__cxx11::string::compare(pcVar12);
      if (iVar10 == 0) {
        local_450 = *piVar26;
      }
      else {
        iVar10 = std::__cxx11::string::compare(pcVar12);
        if (iVar10 == 0) {
          local_468._0_4_ = *piVar26;
        }
        else {
          iVar10 = std::__cxx11::string::compare(pcVar12);
          if (iVar10 == 0) {
            local_480._0_4_ = *piVar26;
          }
        }
      }
    }
    lVar16 = lVar16 + 0x28;
  } while ((uVar29 + (uVar29 == 0)) * 0x28 != lVar16);
  if ((long)local_448.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_448.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar2 = (local_448.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    uVar29 = (ulong)local_408.width;
    lVar16 = (long)local_408.height * uVar29;
    local_480 = (float *)malloc(lVar16 * 0x10);
    *out_rgba = local_480;
    iVar10 = (int)sVar2;
    if (local_180 == 0) {
      if (lVar16 != 0) {
        puVar3 = local_408.images[iVar10];
        local_480 = local_480 + 3;
        lVar14 = 0;
        do {
          fVar30 = *(float *)(puVar3 + lVar14 * 4);
          local_480[-3] = fVar30;
          local_480[-2] = fVar30;
          local_480[-1] = fVar30;
          *local_480 = fVar30;
          lVar14 = lVar14 + 1;
          local_480 = local_480 + 4;
        } while (lVar16 - lVar14 != 0);
      }
    }
    else if (0 < (long)local_408.num_tiles) {
      lVar16 = (long)local_17c;
      local_478 = 0;
      do {
        if (local_178 != 0) {
          pEVar28 = local_408.tiles + local_478;
          lVar14 = 0;
          lVar25 = 0;
          do {
            if (local_17c != 0) {
              uVar27 = pEVar28->offset_x * lVar16;
              uVar15 = (long)pEVar28->offset_y * (long)local_178 + lVar25;
              pfVar18 = local_480 + (uVar29 * uVar15 + uVar27) * 4 + 3;
              lVar17 = lVar16;
              lVar20 = lVar14;
              do {
                if ((uVar27 < uVar29) && (uVar15 < (ulong)(long)local_408.height)) {
                  puVar3 = pEVar28->images[iVar10];
                  pfVar18[-3] = *(float *)(puVar3 + lVar20);
                  pfVar18[-2] = *(float *)(puVar3 + lVar20);
                  pfVar18[-1] = *(float *)(puVar3 + lVar20);
                  *pfVar18 = *(float *)(puVar3 + lVar20);
                }
                pfVar18 = pfVar18 + 4;
                uVar27 = uVar27 + 1;
                lVar20 = lVar20 + 4;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            lVar25 = lVar25 + 1;
            lVar14 = lVar14 + lVar16 * 4;
          } while (lVar25 != local_178);
        }
        local_478 = local_478 + 1;
      } while (local_478 != local_408.num_tiles);
    }
LAB_005d43d9:
    *local_3a8 = local_408.width;
    *local_3a0 = local_408.height;
    iVar10 = 0;
  }
  else {
    if (local_470 == -1) {
      pcVar19 = "R channel not found";
      pcVar12 = "";
    }
    else if (local_450 == -1) {
      pcVar19 = "G channel not found";
      pcVar12 = "";
    }
    else {
      if ((int)local_468 != -1) {
        uVar29 = (ulong)local_408.width;
        lVar16 = (long)local_408.height * uVar29;
        local_460 = (float *)malloc(lVar16 * 0x10);
        *out_rgba = local_460;
        if (local_180 == 0) {
          if (lVar16 != 0) {
            puVar3 = local_408.images[local_470];
            puVar5 = local_408.images[local_450];
            puVar6 = local_408.images[(int)local_468];
            local_460 = local_460 + 3;
            lVar14 = 0;
            do {
              local_460[-3] = *(float *)(puVar3 + lVar14 * 4);
              local_460[-2] = *(float *)(puVar5 + lVar14 * 4);
              local_460[-1] = *(float *)(puVar6 + lVar14 * 4);
              fVar30 = 1.0;
              if ((int)local_480 != -1) {
                fVar30 = *(float *)(local_408.images[(int)local_480] + lVar14 * 4);
              }
              *local_460 = fVar30;
              lVar14 = lVar14 + 1;
              local_460 = local_460 + 4;
            } while (lVar16 - lVar14 != 0);
          }
        }
        else {
          local_3b0 = (long)local_408.num_tiles;
          if (0 < local_3b0) {
            lVar16 = (long)local_17c;
            local_3b8 = local_408.tiles;
            lVar14 = (long)(int)local_468;
            local_468 = 0;
            do {
              if (local_178 != 0) {
                pEVar28 = local_408.tiles + local_468;
                lVar17 = 0;
                lVar25 = 0;
                do {
                  if (local_17c != 0) {
                    uVar15 = pEVar28->offset_x * lVar16;
                    uVar27 = (long)pEVar28->offset_y * (long)local_178 + lVar25;
                    pfVar18 = local_460 + (uVar29 * uVar27 + uVar15) * 4 + 3;
                    lVar20 = lVar16;
                    lVar21 = lVar17;
                    do {
                      if ((uVar15 < uVar29) && (uVar27 < (ulong)(long)local_408.height)) {
                        ppuVar4 = pEVar28->images;
                        pfVar18[-3] = *(float *)(ppuVar4[local_470] + lVar21);
                        pfVar18[-2] = *(float *)(ppuVar4[local_450] + lVar21);
                        pfVar18[-1] = *(float *)(ppuVar4[lVar14] + lVar21);
                        fVar30 = 1.0;
                        if ((int)local_480 != -1) {
                          fVar30 = *(float *)(ppuVar4[(int)local_480] + lVar21);
                        }
                        *pfVar18 = fVar30;
                      }
                      lVar21 = lVar21 + 4;
                      pfVar18 = pfVar18 + 4;
                      uVar15 = uVar15 + 1;
                      lVar20 = lVar20 + -1;
                    } while (lVar20 != 0);
                  }
                  lVar25 = lVar25 + 1;
                  lVar17 = lVar17 + lVar16 * 4;
                } while (lVar25 != local_178);
              }
              local_468 = local_468 + 1;
            } while (local_468 != local_3b0);
          }
        }
        goto LAB_005d43d9;
      }
      pcVar19 = "B channel not found";
      pcVar12 = "";
    }
    local_360 = (undefined1  [8])&local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,pcVar19,pcVar12);
    if (err != (char **)0x0) {
      pcVar12 = strdup((char *)local_360);
      *err = pcVar12;
    }
    if (local_360 != (undefined1  [8])&local_350) {
      operator_delete((void *)local_360,local_350 + 1);
    }
    iVar10 = -4;
  }
LAB_005d4498:
  FreeEXRHeader((EXRHeader *)local_1b8);
  FreeEXRImage(&local_408);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&local_448);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return iVar10;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);


  if (channels.size() < 1) {
    if (layername == NULL) {
      tinyexr::SetErrorMessage("Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer.", err);

    } else {
      tinyexr::SetErrorMessage("Layer Not Found", err);
    }
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
              static_cast<size_t>(exr_image.tiles[it].offset_x) * tile_size_x +
              i;
            const size_t jj =
              static_cast<size_t>(exr_image.tiles[it].offset_y) * tile_size_y +
              j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}